

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemberSymbols.cpp
# Opt level: O2

void __thiscall
slang::ast::ContinuousAssignSymbol::serializeTo
          (ContinuousAssignSymbol *this,ASTSerializer *serializer)

{
  Expression *__n;
  TimingControl *__n_00;
  pair<std::optional<slang::ast::DriveStrength>,_std::optional<slang::ast::DriveStrength>_> pVar1;
  string_view sVar2;
  
  __n = getAssignment(this);
  ASTSerializer::write(serializer,10,"assignment",(size_t)__n);
  __n_00 = getDelay(this);
  if (__n_00 != (TimingControl *)0x0) {
    ASTSerializer::write(serializer,5,"delay",(size_t)__n_00);
  }
  pVar1 = getDriveStrength(this);
  if (((ulong)pVar1.first.super__Optional_base<slang::ast::DriveStrength,_true,_true>._M_payload.
              super__Optional_payload_base<slang::ast::DriveStrength>.
              super__Optional_base<slang::ast::DriveStrength,_true,_true> >> 0x20 & 1) != 0) {
    sVar2 = ast::toString(pVar1.first.super__Optional_base<slang::ast::DriveStrength,_true,_true>.
                          _M_payload.super__Optional_payload_base<slang::ast::DriveStrength>.
                          _M_payload);
    ASTSerializer::write(serializer,0xe,"driveStrength0",sVar2._M_len);
  }
  if (((undefined1  [16])pVar1 & (undefined1  [16])0x100000000) == (undefined1  [16])0x0) {
    return;
  }
  sVar2 = ast::toString(pVar1.second.super__Optional_base<slang::ast::DriveStrength,_true,_true>.
                        _M_payload.super__Optional_payload_base<slang::ast::DriveStrength>.
                        _M_payload);
  ASTSerializer::write(serializer,0xe,"driveStrength1",sVar2._M_len);
  return;
}

Assistant:

void ContinuousAssignSymbol::serializeTo(ASTSerializer& serializer) const {
    serializer.write("assignment", getAssignment());

    if (auto delayCtrl = getDelay())
        serializer.write("delay", *delayCtrl);

    auto [ds0, ds1] = getDriveStrength();
    if (ds0)
        serializer.write("driveStrength0", toString(*ds0));
    if (ds1)
        serializer.write("driveStrength1", toString(*ds1));
}